

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeAddExceptions(unicode_tokenizer *p,int bAlnum,char *zIn,int nIn)

{
  int iVar1;
  uchar *puVar2;
  int *piVar3;
  uchar *puVar4;
  bool bVar5;
  int local_5c;
  int local_58;
  int j;
  int i;
  int nNew;
  int *aNew;
  int nEntry;
  uint iCode;
  uchar *zTerm;
  uchar *z;
  int nIn_local;
  char *zIn_local;
  int bAlnum_local;
  unicode_tokenizer *p_local;
  
  puVar2 = (uchar *)(zIn + nIn);
  aNew._0_4_ = 0;
  zTerm = (uchar *)zIn;
  while (zTerm < puVar2) {
    puVar4 = zTerm + 1;
    aNew._4_4_ = (uint)*zTerm;
    zTerm = puVar4;
    if (0xbf < aNew._4_4_) {
      aNew._4_4_ = (uint)""[aNew._4_4_ - 0xc0];
      while( true ) {
        bVar5 = false;
        if (zTerm != puVar2) {
          bVar5 = (*zTerm & 0xc0) == 0x80;
        }
        if (!bVar5) break;
        aNew._4_4_ = aNew._4_4_ * 0x40 + (*zTerm & 0x3f);
        zTerm = zTerm + 1;
      }
      if (((aNew._4_4_ < 0x80) || ((aNew._4_4_ & 0xfffff800) == 0xd800)) ||
         ((aNew._4_4_ & 0xfffffffe) == 0xfffe)) {
        aNew._4_4_ = 0xfffd;
      }
    }
    iVar1 = sqlite3FtsUnicodeIsalnum(aNew._4_4_);
    if ((iVar1 != bAlnum) && (iVar1 = sqlite3FtsUnicodeIsdiacritic(aNew._4_4_), iVar1 == 0)) {
      aNew._0_4_ = (int)aNew + 1;
    }
  }
  if ((int)aNew != 0) {
    piVar3 = (int *)sqlite3_realloc64(p->aiException,(long)(p->nException + (int)aNew) << 2);
    if (piVar3 == (int *)0x0) {
      return 7;
    }
    j = p->nException;
    zTerm = (uchar *)zIn;
    while (zTerm < puVar2) {
      puVar4 = zTerm + 1;
      aNew._4_4_ = (uint)*zTerm;
      zTerm = puVar4;
      if (0xbf < aNew._4_4_) {
        aNew._4_4_ = (uint)""[aNew._4_4_ - 0xc0];
        while( true ) {
          bVar5 = false;
          if (zTerm != puVar2) {
            bVar5 = (*zTerm & 0xc0) == 0x80;
          }
          if (!bVar5) break;
          aNew._4_4_ = aNew._4_4_ * 0x40 + (*zTerm & 0x3f);
          zTerm = zTerm + 1;
        }
        if (((aNew._4_4_ < 0x80) || ((aNew._4_4_ & 0xfffff800) == 0xd800)) ||
           ((aNew._4_4_ & 0xfffffffe) == 0xfffe)) {
          aNew._4_4_ = 0xfffd;
        }
      }
      iVar1 = sqlite3FtsUnicodeIsalnum(aNew._4_4_);
      if ((iVar1 != bAlnum) && (iVar1 = sqlite3FtsUnicodeIsdiacritic(aNew._4_4_), iVar1 == 0)) {
        local_58 = 0;
        while( true ) {
          bVar5 = false;
          if (local_58 < j) {
            bVar5 = piVar3[local_58] < (int)aNew._4_4_;
          }
          if (!bVar5) break;
          local_58 = local_58 + 1;
        }
        for (local_5c = j; local_58 < local_5c; local_5c = local_5c + -1) {
          piVar3[local_5c] = piVar3[local_5c + -1];
        }
        piVar3[local_58] = aNew._4_4_;
        j = j + 1;
      }
    }
    p->aiException = piVar3;
    p->nException = j;
  }
  return 0;
}

Assistant:

static int unicodeAddExceptions(
  unicode_tokenizer *p,           /* Tokenizer to add exceptions to */
  int bAlnum,                     /* Replace Isalnum() return value with this */
  const char *zIn,                /* Array of characters to make exceptions */
  int nIn                         /* Length of z in bytes */
){
  const unsigned char *z = (const unsigned char *)zIn;
  const unsigned char *zTerm = &z[nIn];
  unsigned int iCode;
  int nEntry = 0;

  assert( bAlnum==0 || bAlnum==1 );

  while( z<zTerm ){
    READ_UTF8(z, zTerm, iCode);
    assert( (sqlite3FtsUnicodeIsalnum((int)iCode) & 0xFFFFFFFE)==0 );
    if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum 
     && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0 
    ){
      nEntry++;
    }
  }

  if( nEntry ){
    int *aNew;                    /* New aiException[] array */
    int nNew;                     /* Number of valid entries in array aNew[] */

    aNew = sqlite3_realloc64(p->aiException,(p->nException+nEntry)*sizeof(int));
    if( aNew==0 ) return SQLITE_NOMEM;
    nNew = p->nException;

    z = (const unsigned char *)zIn;
    while( z<zTerm ){
      READ_UTF8(z, zTerm, iCode);
      if( sqlite3FtsUnicodeIsalnum((int)iCode)!=bAlnum 
       && sqlite3FtsUnicodeIsdiacritic((int)iCode)==0
      ){
        int i, j;
        for(i=0; i<nNew && aNew[i]<(int)iCode; i++);
        for(j=nNew; j>i; j--) aNew[j] = aNew[j-1];
        aNew[i] = (int)iCode;
        nNew++;
      }
    }
    p->aiException = aNew;
    p->nException = nNew;
  }

  return SQLITE_OK;
}